

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

result_type __thiscall Catch::SimplePcg32::operator()(SimplePcg32 *this)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  
  uVar1 = this->m_state;
  uVar2 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
  bVar3 = (byte)(uVar1 >> 0x3b);
  this->m_state = uVar1 * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
  return uVar2 >> bVar3 | uVar2 << 0x20 - bVar3;
}

Assistant:

SimplePcg32::result_type SimplePcg32::operator()() {
        // prepare the output value
        const uint32_t xorshifted = static_cast<uint32_t>(((m_state >> 18u) ^ m_state) >> 27u);
        const auto output = rotate_right(xorshifted, m_state >> 59u);

        // advance state
        m_state = m_state * 6364136223846793005ULL + s_inc;

        return output;
    }